

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_reservoir_sample.cpp
# Opt level: O3

void __thiscall
duckdb::BaseReservoirSampling::ReplaceElement(BaseReservoirSampling *this,double with_weight)

{
  double dVar1;
  double local_18;
  
  ::std::
  priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
  ::pop(&this->reservoir_weights);
  dVar1 = RandomEngine::NextRandom((RandomEngine *)this,this->min_weight_threshold,1.0);
  local_18 = -(double)(~-(ulong)(with_weight < 0.0) & (ulong)with_weight |
                      (ulong)dVar1 & -(ulong)(with_weight < 0.0));
  ::std::
  priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
  ::emplace<double,unsigned_long&>
            ((priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
              *)&this->reservoir_weights,&local_18,&this->min_weighted_entry_index);
  SetNextEntry(this);
  return;
}

Assistant:

void BaseReservoirSampling::ReplaceElement(double with_weight) {
	//! replace the entry in the reservoir
	//! pop the minimum entry
	reservoir_weights.pop();
	//! now update the reservoir
	//! 8. Let tw = Tw i , r2 = random(tw,1) and vi’s key: ki = (r2)1/wi
	//! 9. The new threshold Tw is the new minimum key of R
	//! we generate a random number between (min_weight_threshold, 1)
	double r2 = random.NextRandom(min_weight_threshold, 1);

	//! if we are merging two reservoir samples use the weight passed
	if (with_weight >= 0) {
		r2 = with_weight;
	}
	//! now we insert the new weight into the reservoir
	reservoir_weights.emplace(-r2, min_weighted_entry_index);
	//! we update the min entry with the new min entry in the reservoir
	SetNextEntry();
}